

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  undefined1 auVar1 [16];
  initializer_list<float> v_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar28;
  int iVar29;
  BilinearPatchMesh *pBVar30;
  float *pfVar31;
  float *pfVar32;
  ShapeIntersection *p2;
  long in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  Float FVar33;
  type tVar34;
  float fVar35;
  Point2f PVar36;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 extraout_var [56];
  undefined1 auVar37 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar38 [64];
  Point3f PVar42;
  Vector3<float> VVar43;
  Float pdf_1;
  Point2f u;
  array<float,_4> w;
  Point3f rp;
  Float pdf;
  Vector3f v11;
  Vector3f v01;
  Vector3f v10;
  Vector3f v00;
  Point3f *p11;
  Point3f *p01;
  Point3f *p10;
  Point3f *p00;
  int *v;
  BilinearPatchMesh *mesh;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  float in_stack_fffffffffffff6a8;
  float in_stack_fffffffffffff6ac;
  undefined4 in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b4;
  array<float,_4> *in_stack_fffffffffffff6b8;
  span<const_float> *in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d4;
  undefined1 in_stack_fffffffffffff6d8 [16];
  StatRegisterer *this_00;
  undefined8 in_stack_fffffffffffff6e8;
  undefined4 in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f4;
  ShapeSampleContext *in_stack_fffffffffffff6f8;
  span<const_float> in_stack_fffffffffffff708;
  float in_stack_fffffffffffff71c;
  float in_stack_fffffffffffff720;
  BilinearPatch *in_stack_fffffffffffff828;
  Vector3f *in_stack_fffffffffffff840;
  Vector3f *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  Vector3f *in_stack_fffffffffffff858;
  Float in_stack_fffffffffffff97c;
  Ray *in_stack_fffffffffffff980;
  BilinearPatch *in_stack_fffffffffffff988;
  Interaction *in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9b0;
  Point3f *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  Vector3f *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  Point3f *in_stack_fffffffffffffab8;
  float local_51c;
  type local_458;
  float local_454;
  undefined8 local_450;
  float local_448;
  undefined8 local_440;
  float local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  type local_410;
  float local_40c;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  type local_3c8;
  float local_3c4;
  undefined8 local_3c0;
  float local_3b8;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  float local_398;
  undefined8 local_390;
  float local_388;
  type local_380;
  float local_37c;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  float *local_368;
  undefined8 local_360;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  Normal3<float> local_328;
  float local_31c;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  Point3f *local_198;
  Point3f *local_190;
  Point3f *local_188;
  Point3f *local_180;
  int *local_178;
  BilinearPatchMesh *local_170;
  undefined4 local_168;
  __0 local_151;
  optional<pbrt::ShapeIntersection> local_150;
  long local_18;
  float local_4;
  undefined1 auVar41 [56];
  
  local_18 = in_RSI;
  ShapeSampleContext::SpawnRay
            (in_stack_fffffffffffff6f8,
             (Vector3f *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
  uVar39 = 0;
  Intersect(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
  this_00 = in_stack_fffffffffffff6d8._8_8_;
  if (PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') {
    iVar29 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::
                                  reg);
    this_00 = in_stack_fffffffffffff6d8._8_8_;
    uVar39 = extraout_XMM0_Qb;
    if (iVar29 != 0) {
      PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3_const&)_const::$_0::
      operator_cast_to_function_pointer(&local_151);
      this_00 = in_stack_fffffffffffff6d8._8_8_;
      StatRegisterer::StatRegisterer
                (this_00,in_stack_fffffffffffff6d8._0_8_,
                 (PixelAccumFunc)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
      __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
      uVar39 = extraout_XMM0_Qb_00;
    }
  }
  in_FS_OFFSET[-0x8d] = in_FS_OFFSET[-0x8d] + 1;
  bVar27 = pstd::optional<pbrt::ShapeIntersection>::has_value(&local_150);
  if (!bVar27) {
    *(long *)(*in_FS_OFFSET + -0x470) = *(long *)(*in_FS_OFFSET + -0x470) + 1;
  }
  bVar27 = pstd::optional::operator_cast_to_bool((optional *)&local_150);
  if (bVar27) {
    local_170 = GetMesh((BilinearPatch *)0x7990fc);
    local_178 = local_170->vertexIndices + (*(int *)(in_RDI + 4) << 2);
    local_180 = local_170->p + *local_178;
    local_188 = local_170->p + local_178[1];
    local_190 = local_170->p + local_178[2];
    local_198 = local_170->p + local_178[3];
    PVar42 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
    local_1d0 = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
    uVar40 = 0;
    auVar26._8_8_ = uVar39;
    auVar26._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
    local_1d8 = vmovlpd_avx(auVar26);
    local_1c8 = local_1d8;
    local_1c0 = local_1d0;
    VVar43 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffff6c0,
                        (Point3<float> *)in_stack_fffffffffffff6b8);
    local_1e0 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar39 = 0;
    auVar25._8_8_ = uVar40;
    auVar25._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_1e8 = vmovlpd_avx(auVar25);
    local_1b8 = local_1e8;
    local_1b0 = local_1e0;
    VVar43 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
    local_1f0 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar40 = 0;
    auVar24._8_8_ = uVar39;
    auVar24._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_1f8 = vmovlpd_avx(auVar24);
    local_1a8 = local_1f8;
    local_1a0 = local_1f0;
    PVar42 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
    local_230 = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
    uVar39 = 0;
    auVar23._8_8_ = uVar40;
    auVar23._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
    local_238 = vmovlpd_avx(auVar23);
    local_228 = local_238;
    local_220 = local_230;
    VVar43 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffff6c0,
                        (Point3<float> *)in_stack_fffffffffffff6b8);
    local_240 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar40 = 0;
    auVar22._8_8_ = uVar39;
    auVar22._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_248 = vmovlpd_avx(auVar22);
    local_218 = local_248;
    local_210 = local_240;
    VVar43 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
    fVar35 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar39 = 0;
    auVar21._8_8_ = uVar40;
    auVar21._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_258 = vmovlpd_avx(auVar21);
    local_250 = fVar35;
    local_208 = local_258;
    local_200 = fVar35;
    PVar42 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
    local_290 = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
    uVar40 = 0;
    auVar20._8_8_ = uVar39;
    auVar20._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
    local_298 = vmovlpd_avx(auVar20);
    local_288 = local_298;
    local_280 = local_290;
    VVar43 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffff6c0,
                        (Point3<float> *)in_stack_fffffffffffff6b8);
    local_2a0 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar39 = 0;
    auVar19._8_8_ = uVar40;
    auVar19._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_2a8 = vmovlpd_avx(auVar19);
    local_278 = local_2a8;
    local_270 = local_2a0;
    VVar43 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
    local_2b0 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar40 = 0;
    auVar18._8_8_ = uVar39;
    auVar18._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_2b8 = vmovlpd_avx(auVar18);
    local_268 = local_2b8;
    local_260 = local_2b0;
    PVar42 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
    local_2f0 = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
    uVar39 = 0;
    auVar17._8_8_ = uVar40;
    auVar17._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
    local_2f8 = vmovlpd_avx(auVar17);
    local_2e8 = local_2f8;
    local_2e0 = local_2f0;
    VVar43 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffff6c0,
                        (Point3<float> *)in_stack_fffffffffffff6b8);
    local_300 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar40 = 0;
    auVar16._8_8_ = uVar39;
    auVar16._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_308 = vmovlpd_avx(auVar16);
    local_2d8 = local_308;
    local_2d0 = local_300;
    VVar43 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
    local_310 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._8_8_ = uVar40;
    auVar15._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_318 = vmovlpd_avx(auVar15);
    local_2c8 = local_318;
    local_2c0 = local_310;
    bVar27 = IsRectangle(in_stack_fffffffffffff828);
    if (((!bVar27) ||
        (pBVar30 = GetMesh((BilinearPatch *)0x799715),
        pBVar30->imageDistribution != (PiecewiseConstant2D *)0x0)) ||
       (FVar33 = SphericalQuadArea(in_stack_fffffffffffff858,
                                   (Vector3f *)
                                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                   in_stack_fffffffffffff848,in_stack_fffffffffffff840),
       FVar33 <= 0.0001)) {
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x79a055);
      FVar33 = PDF((BilinearPatch *)CONCAT44(fVar35,in_stack_fffffffffffff9b0),
                   in_stack_fffffffffffff9a8);
      auVar41 = extraout_var;
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x79a089);
      VVar43 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
      auVar37._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar37._8_56_ = auVar41;
      vmovlpd_avx(auVar37._0_16_);
      tVar34 = AbsDot<float>((Normal3<float> *)
                             CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                             (Vector3<float> *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      auVar41 = extraout_var_00;
      PVar42 = ShapeSampleContext::p
                         ((ShapeSampleContext *)
                          CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
      fVar35 = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
      auVar38._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar38._8_56_ = auVar41;
      uVar39 = 0;
      vmovlpd_avx(auVar38._0_16_);
      p2 = pstd::optional<pbrt::ShapeIntersection>::operator->
                     ((optional<pbrt::ShapeIntersection> *)0x79a173);
      PVar42 = Interaction::p((Interaction *)
                              CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
      auVar1._8_8_ = uVar39;
      auVar1._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
      vmovlpd_avx(auVar1);
      fVar35 = DistanceSquared<float>
                         ((Point3<float> *)CONCAT44(fVar35,in_stack_fffffffffffff6d0),
                          (Point3<float> *)p2);
      local_51c = FVar33 / (tVar34 / fVar35);
      eVar28 = IsInf<float>(0.0);
      if (eVar28) {
        local_51c = 0.0;
      }
      local_4 = local_51c;
    }
    else {
      FVar33 = SphericalQuadArea(in_stack_fffffffffffff858,
                                 (Vector3f *)
                                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                                 in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      local_31c = 1.0 / FVar33;
      uVar39 = 0;
      Normal3<float>::Normal3
                ((Normal3<float> *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                 in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8,0.0);
      bVar27 = Tuple3<pbrt::Normal3,_float>::operator!=
                         ((Tuple3<pbrt::Normal3,_float> *)(local_18 + 0x24),&local_328);
      if (bVar27) {
        PVar42 = ShapeSampleContext::p
                           ((ShapeSampleContext *)
                            CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
        local_340 = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
        uVar40 = 0;
        auVar14._8_8_ = uVar39;
        auVar14._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_348 = vmovlpd_avx(auVar14);
        local_37c = 0.01;
        local_338 = local_348;
        local_330 = local_340;
        VVar43 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff6c0,
                            (Point3<float> *)in_stack_fffffffffffff6b8);
        local_3a8 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar39 = 0;
        auVar13._8_8_ = uVar40;
        auVar13._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3b0 = vmovlpd_avx(auVar13);
        local_3a0 = local_3b0;
        local_398 = local_3a8;
        VVar43 = Normalize<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
        local_3b8 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar12._8_8_ = uVar39;
        auVar12._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3c0 = vmovlpd_avx(auVar12);
        local_390 = local_3c0;
        local_388 = local_3b8;
        local_380 = AbsDot<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                                  (Normal3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        pfVar31 = std::max<float>(&local_37c,&local_380);
        local_378 = *pfVar31;
        uVar39 = 0;
        pfVar31 = &local_374;
        local_3c4 = 0.01;
        VVar43 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff6c0,
                            (Point3<float> *)in_stack_fffffffffffff6b8);
        local_3f0 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar40 = 0;
        auVar11._8_8_ = uVar39;
        auVar11._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3f8 = vmovlpd_avx(auVar11);
        local_3e8 = local_3f8;
        local_3e0 = local_3f0;
        VVar43 = Normalize<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
        local_400 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar10._8_8_ = uVar40;
        auVar10._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_408 = vmovlpd_avx(auVar10);
        local_3d8 = local_408;
        local_3d0 = local_400;
        local_3c8 = AbsDot<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                                  (Normal3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        pfVar32 = std::max<float>(&local_3c4,&local_3c8);
        uVar39 = 0;
        *pfVar31 = *pfVar32;
        local_40c = 0.01;
        VVar43 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff6c0,
                            (Point3<float> *)in_stack_fffffffffffff6b8);
        local_438 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar40 = 0;
        auVar9._8_8_ = uVar39;
        auVar9._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_440 = vmovlpd_avx(auVar9);
        local_430 = local_440;
        local_428 = local_438;
        VVar43 = Normalize<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
        local_448 = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar8._8_8_ = uVar40;
        auVar8._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_450 = vmovlpd_avx(auVar8);
        local_420 = local_450;
        local_418 = local_448;
        local_410 = AbsDot<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                                  (Normal3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        pfVar31 = std::max<float>(&local_40c,&local_410);
        local_370 = *pfVar31;
        uVar39 = 0;
        local_454 = 0.01;
        VVar43 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff6c0,
                            (Point3<float> *)in_stack_fffffffffffff6b8);
        uVar40 = 0;
        auVar7._8_8_ = uVar39;
        auVar7._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        vmovlpd_avx(auVar7);
        VVar43 = Normalize<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
        auVar6._8_8_ = uVar40;
        auVar6._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        vmovlpd_avx(auVar6);
        local_458 = AbsDot<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                                  (Normal3<float> *)
                                  CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        pfVar31 = std::max<float>(&local_454,&local_458);
        local_36c = *pfVar31;
        uVar39 = 0;
        local_368 = &local_378;
        local_360 = 4;
        v_00._M_len._0_4_ = in_stack_fffffffffffff6f0;
        v_00._M_array = (iterator)in_stack_fffffffffffff6e8;
        v_00._M_len._4_4_ = in_stack_fffffffffffff6f4;
        pstd::array<float,_4>::array((array<float,_4> *)this_00,v_00);
        VVar43 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff6c0,
                            (Point3<float> *)in_stack_fffffffffffff6b8);
        uVar40 = 0;
        auVar5._8_8_ = uVar39;
        auVar5._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        vmovlpd_avx(auVar5);
        VVar43 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff6c0,
                            (Point3<float> *)in_stack_fffffffffffff6b8);
        uVar39 = 0;
        auVar4._8_8_ = uVar40;
        auVar4._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        vmovlpd_avx(auVar4);
        pstd::optional<pbrt::ShapeIntersection>::operator->
                  ((optional<pbrt::ShapeIntersection> *)0x799ef6);
        PVar42 = Interaction::p((Interaction *)
                                CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
        auVar3._8_8_ = uVar39;
        auVar3._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
        vmovlpd_avx(auVar3);
        PVar36 = InvertSphericalRectangleSample
                           (in_stack_fffffffffffffab8,
                            (Point3f *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                            ,in_stack_fffffffffffffaa8,
                            (Vector3f *)
                            CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                            in_stack_fffffffffffffa98);
        auVar2._8_8_ = extraout_XMM0_Qb_01;
        auVar2._0_4_ = PVar36.super_Tuple2<pbrt::Point2,_float>.x;
        auVar2._4_4_ = PVar36.super_Tuple2<pbrt::Point2,_float>.y;
        vmovlpd_avx(auVar2);
        pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                  (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
        PVar36.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff720;
        PVar36.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff71c;
        FVar33 = BilinearPDF(PVar36,in_stack_fffffffffffff708);
        local_4 = FVar33 * local_31c;
      }
      else {
        local_4 = local_31c;
      }
    }
  }
  else {
    local_4 = 0.0;
  }
  local_168 = 1;
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x79a263);
  return local_4;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    CHECK_RARE(1e-6, !isect.has_value());
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !GetMesh()->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}